

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O3

void __thiscall
SeedTree::SeedTree(SeedTree *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *seed,
                  size_t num_leaves,limbo_salt_t *salt,size_t rep_idx)

{
  _Bit_type *p_Var1;
  pointer poVar2;
  int iVar3;
  pointer puVar4;
  ulong uVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  size_type __new_size;
  void *pvVar14;
  long lVar15;
  long lVar16;
  _Storage<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false> local_b8;
  char local_a0;
  vector<bool,_std::allocator<bool>_> *local_90;
  _Storage<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false> local_88;
  char local_70;
  undefined7 uStack_6f;
  void *local_68;
  long local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  limbo_salt_t *local_40;
  size_t local_38;
  
  local_90 = &this->_node_exists;
  *(undefined8 *)
   &(this->_node_exists).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->_node_exists).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  *(undefined8 *)
   &(this->_node_exists).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._M_offset = 0;
  (this->_node_exists).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->_data).
  super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_node_exists).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->_data).
  super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_data).
  super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->_num_leaves = num_leaves;
  uVar7 = (int)num_leaves - 1;
  if (uVar7 == 0) {
    bVar6 = 0;
  }
  else {
    iVar3 = 0x1f;
    if (uVar7 != 0) {
      for (; uVar7 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    bVar6 = (byte)iVar3 ^ 0x1f;
  }
  bVar6 = 0x20 - bVar6;
  if ((int)num_leaves == 0) {
    bVar6 = 0;
  }
  __new_size = ((long)(2 << (bVar6 & 0x1f)) + (num_leaves - (long)(1 << (bVar6 & 0x1f)))) - 1;
  this->_num_total_nodes = __new_size;
  local_40 = salt;
  local_38 = rep_idx;
  std::vector<bool,_std::allocator<bool>_>::resize(local_90,__new_size,false);
  p_Var1 = (this->_node_exists).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  uVar8 = this->_num_total_nodes - num_leaves;
  if (uVar8 < this->_num_total_nodes) {
    do {
      uVar11 = uVar8 + 0x3f;
      if (-1 < (long)uVar8) {
        uVar11 = uVar8;
      }
      p_Var1[((long)uVar11 >> 6) +
             (ulong)((uVar8 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] =
           p_Var1[((long)uVar11 >> 6) +
                  (ulong)((uVar8 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] |
           1L << ((byte)uVar8 & 0x3f);
      uVar8 = uVar8 + 1;
    } while (uVar8 < this->_num_total_nodes);
    uVar8 = this->_num_total_nodes - num_leaves;
  }
  if (uVar8 != 0) {
    uVar11 = uVar8 * 2 + 1;
    do {
      if (uVar11 < this->_num_total_nodes) {
        uVar12 = uVar11 + 0x3f;
        if (-1 < (long)uVar11) {
          uVar12 = uVar11;
        }
        if ((p_Var1[((long)uVar12 >> 6) +
                    (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff
                   ] >> (uVar11 & 0x3f) & 1) == 0) goto LAB_00112b66;
LAB_00112ba1:
        uVar12 = uVar8 + 0x3f;
        if (-1 < (long)uVar8) {
          uVar12 = uVar8;
        }
        p_Var1[((long)uVar12 >> 6) +
               (ulong)((uVar8 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] =
             p_Var1[((long)uVar12 >> 6) +
                    (ulong)((uVar8 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff]
             | 1L << ((byte)uVar8 & 0x3f);
      }
      else {
LAB_00112b66:
        uVar12 = uVar11 + 1;
        if (uVar12 < this->_num_total_nodes) {
          uVar13 = uVar11 + 0x40;
          if (-1 < (long)uVar12) {
            uVar13 = uVar12;
          }
          if ((p_Var1[((long)uVar13 >> 6) +
                      (ulong)((uVar12 & 0x800000000000003e) < 0x8000000000000001) +
                      0xffffffffffffffff] >> ((uint)uVar12 & 0x3e) & 1) != 0) goto LAB_00112ba1;
        }
      }
      uVar11 = uVar11 - 2;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  *(byte *)p_Var1 = (byte)*p_Var1 | 1;
  std::
  vector<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::resize(&this->_data,this->_num_total_nodes);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_88._M_value,seed);
  local_70 = '\x01';
  std::_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
  _M_move_assign((_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)(this->_data).
                    super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                 (_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)&local_88._M_value);
  if ((local_70 == '\x01') &&
     (local_70 = '\0',
     local_88._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
     super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_88._M_value.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88._M_value.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage - local_88._0_8_);
  }
  uVar11 = (this->_num_total_nodes >> 1) - 1;
  lVar16 = 0x20;
  uVar12 = 1;
  lVar15 = 0;
  uVar8 = 0x800000000000003f;
  local_48 = 0x800000000000003e;
  uVar13 = 0;
  local_58 = 0x800000000000003f;
  local_50 = uVar11;
  do {
    if (uVar13 < this->_num_total_nodes) {
      uVar5 = uVar13 + 0x3f;
      if (-1 < (long)uVar13) {
        uVar5 = uVar13;
      }
      if (((local_90->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [((long)uVar5 >> 6) + (ulong)((uVar13 & uVar8) < 0x8000000000000001) + 0xffffffffffffffff
           ] >> (uVar13 & 0x3f) & 1) != 0) {
        poVar2 = (this->_data).
                 super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (*(char *)((long)&(poVar2->
                             super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                             )._M_payload + lVar15 + 0x18) == '\0') {
          std::__throw_bad_optional_access();
        }
        expandSeed((pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&local_88._M_value,(SeedTree *)0x8000000000000000,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   ((long)&(poVar2->
                           super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                           )._M_payload + lVar15),local_40,local_38,uVar13);
        uVar5 = this->_num_total_nodes;
        if (uVar12 < uVar5) {
          uVar9 = uVar12 + 0x3f;
          if (-1 < (long)uVar12) {
            uVar9 = uVar12;
          }
          if (((local_90->super__Bvector_base<std::allocator<bool>_>)._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
               [((long)uVar9 >> 6) +
                (ulong)((uVar12 & uVar8) < 0x8000000000000001) + 0xffffffffffffffff] >>
               (uVar12 & 0x3f) & 1) != 0) {
            local_b8._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_b8._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_b8._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            uVar8 = (long)local_88._M_value.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish - local_88._0_8_;
            if (uVar8 == 0) {
              puVar4 = (pointer)0x0;
              sVar10 = 0;
            }
            else {
              if ((long)uVar8 < 0) {
                std::__throw_bad_alloc();
              }
              puVar4 = (pointer)operator_new(uVar8);
              sVar10 = (long)local_88._M_value.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish - local_88._0_8_;
            }
            local_b8._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = puVar4 + uVar8;
            local_b8._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start = puVar4;
            if (local_88._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish !=
                local_88._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start) {
              local_b8._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish = puVar4;
              memmove(puVar4,local_88._M_value.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,sVar10);
            }
            local_b8._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish = puVar4 + sVar10;
            local_a0 = '\x01';
            std::_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::_M_move_assign((_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)((long)&(((this->_data).
                                          super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                                        )._M_payload + lVar16),
                             (_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)&local_b8._M_value);
            uVar11 = local_50;
            uVar8 = local_58;
            if ((local_a0 == '\x01') &&
               (local_a0 = '\0',
               local_b8._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
              operator_delete(local_b8._M_value.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_b8._M_value.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              local_b8._0_8_);
            }
            uVar5 = this->_num_total_nodes;
          }
        }
        uVar9 = uVar12 + 1;
        if (uVar9 < uVar5) {
          uVar5 = uVar12 + 0x40;
          if (-1 < (long)uVar9) {
            uVar5 = uVar9;
          }
          if (((local_90->super__Bvector_base<std::allocator<bool>_>)._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
               [((long)uVar5 >> 6) +
                (ulong)((uVar9 & local_48) < 0x8000000000000001) + 0xffffffffffffffff] >>
               ((uint)uVar9 & 0x3e) & 1) != 0) {
            pvVar14 = (void *)CONCAT71(uStack_6f,local_70);
            local_b8._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_b8._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_b8._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            uVar8 = (long)local_68 - (long)pvVar14;
            if (uVar8 == 0) {
              puVar4 = (pointer)0x0;
              sVar10 = 0;
            }
            else {
              if ((long)uVar8 < 0) {
                std::__throw_bad_alloc();
              }
              puVar4 = (pointer)operator_new(uVar8);
              pvVar14 = (void *)CONCAT71(uStack_6f,local_70);
              sVar10 = (long)local_68 - (long)pvVar14;
            }
            local_b8._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = puVar4 + uVar8;
            local_b8._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start = puVar4;
            if (local_68 != pvVar14) {
              local_b8._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish = puVar4;
              memmove(puVar4,pvVar14,sVar10);
            }
            local_b8._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish = puVar4 + sVar10;
            local_a0 = '\x01';
            std::_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::_M_move_assign((_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)((long)&(this->_data).
                                        super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[1].
                                        super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                                        ._M_payload + lVar16),
                             (_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)&local_b8._M_value);
            uVar11 = local_50;
            uVar8 = local_58;
            if ((local_a0 == '\x01') &&
               (local_a0 = '\0',
               local_b8._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
              operator_delete(local_b8._M_value.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_b8._M_value.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              local_b8._0_8_);
            }
          }
        }
        pvVar14 = (void *)CONCAT71(uStack_6f,local_70);
        if (pvVar14 != (void *)0x0) {
          operator_delete(pvVar14,local_60 - (long)pvVar14);
        }
        if (local_88._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_88._M_value.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_88._M_value.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage - local_88._0_8_);
        }
      }
    }
    uVar13 = uVar13 + 1;
    lVar16 = lVar16 + 0x40;
    uVar12 = uVar12 + 2;
    lVar15 = lVar15 + 0x20;
  } while (uVar13 <= uVar11);
  return;
}

Assistant:

SeedTree::SeedTree(std::vector<uint8_t> seed, const size_t num_leaves,
                   const limbo_salt_t &salt, const size_t rep_idx)
    : _data(), _node_exists(), _num_leaves(num_leaves) {
  size_t tree_depth = 1 + ceil_log2(num_leaves);

  _num_total_nodes =
      ((1 << (tree_depth)) - 1) -
      ((1 << (tree_depth - 1)) -
       num_leaves); /* Num nodes in complete - number of missing leaves */

  _node_exists.resize(_num_total_nodes);
  for (size_t i = _num_total_nodes - num_leaves; i < _num_total_nodes; i++) {
    _node_exists[i] = true;
  }

  for (size_t i = _num_total_nodes - num_leaves; i > 0; i--) {
    if (node_exists(2 * i + 1) || node_exists(2 * i + 2)) {
      _node_exists[i] = true;
    }
  }
  _node_exists[0] = true;
  // push back root seed
  _data.resize(_num_total_nodes);
  _data[0] = std::optional(seed);

  size_t last_non_leaf = get_parent(_num_total_nodes - 1);
  for (size_t i = 0; i <= last_non_leaf; i++) {
    if (!node_exists(i))
      continue;
    auto [left, right] = expandSeed(_data[i].value(), salt, rep_idx, i);
    if (node_exists(2 * i + 1)) {
      _data[2 * i + 1] = std::optional(left);
    }
    if (node_exists(2 * i + 2)) {
      _data[2 * i + 2] = std::optional(right);
    }
  }
}